

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_findfile.c
# Opt level: O0

char * checkhome(char *home,char *fname,_Bool dotscore)

{
  int iVar1;
  char *pcVar2;
  char *path;
  char *pcStack_30;
  int fd;
  char *c;
  int i;
  char pref [2];
  _Bool dotscore_local;
  char *fname_local;
  char *home_local;
  
  _i = fname;
  c._7_1_ = dotscore;
  c._5_2_ = 0x5f2e;
  c._0_4_ = 0;
  while( true ) {
    iVar1 = 1;
    if ((c._7_1_ & 1) != 0) {
      iVar1 = 2;
    }
    if (iVar1 <= (int)c) break;
    if ((c._7_1_ & 1) == 0) {
      pcStack_30 = (char *)curl_maprintf("%s/%s",home,_i);
    }
    else {
      pcStack_30 = (char *)curl_maprintf("%s/%c%s",home,(int)*(char *)((long)&c + (long)(int)c + 5),
                                         _i + 1);
    }
    if (pcStack_30 != (char *)0x0) {
      iVar1 = open64(pcStack_30,0);
      if (-1 < iVar1) {
        pcVar2 = strdup(pcStack_30);
        close(iVar1);
        curl_free(pcStack_30);
        return pcVar2;
      }
      curl_free(pcStack_30);
    }
    c._0_4_ = (int)c + 1;
  }
  return (char *)0x0;
}

Assistant:

static char *checkhome(const char *home, const char *fname, bool dotscore)
{
  const char pref[2] = { '.', '_' };
  int i;
  for(i = 0; i < (dotscore ? 2 : 1); i++) {
    char *c;
    if(dotscore)
      c = aprintf("%s" DIR_CHAR "%c%s", home, pref[i], &fname[1]);
    else
      c = aprintf("%s" DIR_CHAR "%s", home, fname);
    if(c) {
      int fd = open(c, O_RDONLY);
      if(fd >= 0) {
        char *path = strdup(c);
        close(fd);
        curl_free(c);
        return path;
      }
      curl_free(c);
    }
  }
  return NULL;
}